

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O3

bool __thiscall
pybind11::detail::
map_caster<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>
::load(map_caster<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>
       *this,handle src,bool convert)

{
  handle src_00;
  PyObject *src_01;
  bool bVar1;
  int iVar2;
  undefined1 local_98 [8];
  value_conv vconv;
  dict_iterator __begin3;
  dict d;
  key_conv kconv;
  
  if ((src.m_ptr == (PyObject *)0x0) || (((src.m_ptr)->ob_type->tp_flags & 0x20000000) == 0)) {
    bVar1 = false;
  }
  else {
    (src.m_ptr)->ob_refcnt = (src.m_ptr)->ob_refcnt + 1;
    __begin3.super_dict_readonly.pos = (ssize_t)src.m_ptr;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>
    ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_kratos::Var_*>_>_>
             *)this);
    __begin3.super_dict_readonly.obj.m_ptr = (PyObject *)0x0;
    __begin3.super_dict_readonly.key = (PyObject *)0x0;
    __begin3.super_dict_readonly.value = (PyObject *)0x0;
    iVar2 = PyDict_Next(src.m_ptr,&__begin3.super_dict_readonly.value,&__begin3,
                        &__begin3.super_dict_readonly.key);
    if ((iVar2 != 0) && (__begin3.super_dict_readonly.value != (PyObject *)0xffffffffffffffff)) {
      do {
        src_01 = __begin3.super_dict_readonly.key;
        src_00.m_ptr = __begin3.super_dict_readonly.obj.m_ptr;
        d.super_object.super_handle.m_ptr =
             (object)&kconv.
                      super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      .value._M_string_length;
        kconv.
        super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
        .value._M_dataplus._M_p = (pointer)0x0;
        kconv.
        super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
        .value._M_string_length._0_1_ = 0;
        type_caster_generic::type_caster_generic
                  ((type_caster_generic *)local_98,(type_info *)&kratos::Var::typeinfo);
        bVar1 = string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                ::load((string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                        *)&d,src_00,convert);
        if (!bVar1) {
LAB_002f0139:
          if (d.super_object.super_handle.m_ptr !=
              (object)&kconv.
                       super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                       .value._M_string_length) {
            operator_delete((void *)d.super_object.super_handle.m_ptr,
                            CONCAT71(kconv.
                                     super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                     .value._M_string_length._1_7_,
                                     (undefined1)
                                     kconv.
                                     super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                     .value._M_string_length) + 1);
          }
          bVar1 = false;
          goto LAB_002f0154;
        }
        bVar1 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                          ((type_caster_generic *)local_98,(handle)src_01,convert);
        if (!bVar1) goto LAB_002f0139;
        vconv.super_type_caster_base<kratos::Var>.super_type_caster_generic.value =
             vconv.super_type_caster_base<kratos::Var>.super_type_caster_generic.cpptype;
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::Var*>,std::_Select1st<std::pair<std::__cxx11::string_const,kratos::Var*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Var*>>>
        ::_M_emplace_unique<std::__cxx11::string,kratos::Var*>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,kratos::Var*>,std::_Select1st<std::pair<std::__cxx11::string_const,kratos::Var*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,kratos::Var*>>>
                    *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d,
                   (Var **)&vconv.super_type_caster_base<kratos::Var>.super_type_caster_generic.
                            value);
        if (d.super_object.super_handle.m_ptr !=
            (object)&kconv.
                     super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                     .value._M_string_length) {
          operator_delete((void *)d.super_object.super_handle.m_ptr,
                          CONCAT71(kconv.
                                   super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                   .value._M_string_length._1_7_,
                                   (undefined1)
                                   kconv.
                                   super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                   .value._M_string_length) + 1);
        }
        iVar2 = PyDict_Next(src.m_ptr,&__begin3.super_dict_readonly.value,&__begin3,
                            &__begin3.super_dict_readonly.key);
      } while ((iVar2 != 0) &&
              (__begin3.super_dict_readonly.value != (PyObject *)0xffffffffffffffff));
    }
    bVar1 = true;
LAB_002f0154:
    object::~object((object *)&__begin3.super_dict_readonly.pos);
  }
  return bVar1;
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<dict>(src))
            return false;
        auto d = reinterpret_borrow<dict>(src);
        value.clear();
        for (auto it : d) {
            key_conv kconv;
            value_conv vconv;
            if (!kconv.load(it.first.ptr(), convert) ||
                !vconv.load(it.second.ptr(), convert))
                return false;
            value.emplace(cast_op<Key &&>(std::move(kconv)), cast_op<Value &&>(std::move(vconv)));
        }
        return true;
    }